

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha512_Final(SHA512_CTX *context,sha2_byte *digest)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  uint64_t uVar43;
  uint64_t uVar44;
  uint64_t uVar45;
  uint64_t uVar46;
  uint64_t uVar47;
  uint64_t uVar48;
  uint64_t uVar49;
  undefined1 auVar50 [15];
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  undefined1 auVar53 [11];
  undefined1 auVar54 [15];
  undefined1 auVar55 [11];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  uint uVar62;
  long lVar63;
  uint uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [11];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar70 [11];
  undefined1 auVar77 [16];
  undefined1 auVar71 [11];
  undefined1 auVar78 [16];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  
  if (digest != (sha2_byte *)0x0) {
    uVar64 = (uint)context->bitcount[0] >> 3 & 0x7f;
    puVar1 = context->buffer;
    uVar62 = uVar64 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar64) = 0x80;
    if (0x6f < uVar64) {
      memzero((void *)((ulong)uVar62 + (long)puVar1),(ulong)(uVar64 ^ 0x7f));
      lVar63 = 10;
      do {
        auVar66 = *(undefined1 (*) [16])(context->state + lVar63);
        auVar76[8] = auVar66[8];
        auVar76[9] = 0;
        auVar76[10] = auVar66[9];
        auVar69._0_10_ = (unkuint10)auVar66[0xc] << 0x40;
        auVar69[10] = auVar66[0xd];
        auVar72[0xb] = 0;
        auVar72._0_11_ = auVar69;
        auVar72[0xc] = auVar66[0xe];
        auVar72[0xd] = 0;
        auVar72[0xe] = auVar66[0xf];
        auVar76[3] = 0;
        auVar76._0_3_ = auVar69._8_3_;
        auVar76._4_3_ = auVar72._12_3_;
        auVar76[7] = 0;
        auVar76[0xb] = 0;
        auVar76._12_3_ = (int3)(CONCAT16(auVar66[0xb],(uint6)auVar66[10] << 0x20) >> 0x20);
        auVar76[0xf] = 0;
        auVar75 = pshuflw(auVar76,auVar76,0x1b);
        auVar76 = pshufhw(auVar75,auVar75,0x1b);
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar66._0_13_;
        auVar19[0xe] = auVar66[7];
        auVar22[0xc] = auVar66[6];
        auVar22._0_12_ = auVar66._0_12_;
        auVar22._13_2_ = auVar19._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar66._0_11_;
        auVar25._12_3_ = auVar22._12_3_;
        auVar28[10] = auVar66[5];
        auVar28._0_10_ = auVar66._0_10_;
        auVar28._11_4_ = auVar25._11_4_;
        auVar31[9] = 0;
        auVar31._0_9_ = auVar66._0_9_;
        auVar31._10_5_ = auVar28._10_5_;
        auVar34[8] = auVar66[4];
        auVar34._0_8_ = auVar66._0_8_;
        auVar34._9_6_ = auVar31._9_6_;
        auVar75[7] = 0;
        auVar75._0_7_ = auVar34._8_7_;
        auVar50._7_8_ = 0;
        auVar50._0_7_ = auVar34._8_7_;
        auVar56._1_8_ = SUB158(auVar50 << 0x40,7);
        auVar56[0] = auVar66[3];
        auVar56._9_6_ = 0;
        auVar51._1_10_ = SUB1510(auVar56 << 0x30,5);
        auVar51[0] = auVar66[2];
        auVar57._11_4_ = 0;
        auVar57._0_11_ = auVar51;
        auVar37[2] = auVar66[1];
        auVar37._0_2_ = auVar66._0_2_;
        auVar37._3_12_ = SUB1512(auVar57 << 0x20,3);
        auVar40._2_13_ = auVar37._2_13_;
        auVar40._0_2_ = auVar66._0_2_ & 0xff;
        auVar75._8_4_ = auVar40._0_4_;
        auVar75._12_4_ = auVar51._0_4_;
        auVar66 = pshuflw(auVar75,auVar75,0x1b);
        auVar66 = pshufhw(auVar66,auVar66,0x1b);
        sVar3 = auVar66._0_2_;
        sVar4 = auVar66._2_2_;
        sVar5 = auVar66._4_2_;
        sVar6 = auVar66._6_2_;
        sVar7 = auVar66._8_2_;
        sVar8 = auVar66._10_2_;
        sVar9 = auVar66._12_2_;
        sVar10 = auVar66._14_2_;
        sVar11 = auVar76._0_2_;
        sVar12 = auVar76._2_2_;
        sVar13 = auVar76._4_2_;
        sVar14 = auVar76._6_2_;
        sVar15 = auVar76._8_2_;
        sVar16 = auVar76._10_2_;
        sVar17 = auVar76._12_2_;
        sVar18 = auVar76._14_2_;
        puVar2 = context->state + lVar63;
        *(char *)puVar2 = (0 < sVar3) * (sVar3 < 0x100) * auVar66[0] - (0xff < sVar3);
        *(char *)((long)puVar2 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar66[2] - (0xff < sVar4);
        *(char *)((long)puVar2 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar66[4] - (0xff < sVar5);
        *(char *)((long)puVar2 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar66[6] - (0xff < sVar6);
        *(char *)((long)puVar2 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar66[8] - (0xff < sVar7);
        *(char *)((long)puVar2 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar66[10] - (0xff < sVar8);
        *(char *)((long)puVar2 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar66[0xc] - (0xff < sVar9);
        *(char *)((long)puVar2 + 7) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar66[0xe] - (0xff < sVar10);
        *(char *)(puVar2 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0] - (0xff < sVar11);
        *(char *)((long)puVar2 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar76[2] - (0xff < sVar12)
        ;
        *(char *)((long)puVar2 + 10) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar76[4] - (0xff < sVar13);
        *(char *)((long)puVar2 + 0xb) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar76[6] - (0xff < sVar14);
        *(char *)((long)puVar2 + 0xc) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar76[8] - (0xff < sVar15);
        *(char *)((long)puVar2 + 0xd) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar76[10] - (0xff < sVar16);
        *(char *)((long)puVar2 + 0xe) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar76[0xc] - (0xff < sVar17);
        *(char *)((long)puVar2 + 0xf) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar76[0xe] - (0xff < sVar18);
        lVar63 = lVar63 + 2;
      } while (lVar63 != 0x1a);
      sha512_Transform(context->state,puVar1,context->state);
      uVar62 = 0;
    }
    memzero((void *)((ulong)uVar62 + (long)puVar1),(ulong)(0x70 - uVar62));
    lVar63 = 10;
    do {
      auVar66 = *(undefined1 (*) [16])(context->state + lVar63);
      auVar77[8] = auVar66[8];
      auVar77[9] = 0;
      auVar77[10] = auVar66[9];
      auVar70._0_10_ = (unkuint10)auVar66[0xc] << 0x40;
      auVar70[10] = auVar66[0xd];
      auVar73[0xb] = 0;
      auVar73._0_11_ = auVar70;
      auVar73[0xc] = auVar66[0xe];
      auVar73[0xd] = 0;
      auVar73[0xe] = auVar66[0xf];
      auVar77[3] = 0;
      auVar77._0_3_ = auVar70._8_3_;
      auVar77._4_3_ = auVar73._12_3_;
      auVar77[7] = 0;
      auVar77[0xb] = 0;
      auVar77._12_3_ = (int3)(CONCAT16(auVar66[0xb],(uint6)auVar66[10] << 0x20) >> 0x20);
      auVar77[0xf] = 0;
      auVar75 = pshuflw(auVar77,auVar77,0x1b);
      auVar75 = pshufhw(auVar75,auVar75,0x1b);
      auVar20[0xd] = 0;
      auVar20._0_13_ = auVar66._0_13_;
      auVar20[0xe] = auVar66[7];
      auVar23[0xc] = auVar66[6];
      auVar23._0_12_ = auVar66._0_12_;
      auVar23._13_2_ = auVar20._13_2_;
      auVar26[0xb] = 0;
      auVar26._0_11_ = auVar66._0_11_;
      auVar26._12_3_ = auVar23._12_3_;
      auVar29[10] = auVar66[5];
      auVar29._0_10_ = auVar66._0_10_;
      auVar29._11_4_ = auVar26._11_4_;
      auVar32[9] = 0;
      auVar32._0_9_ = auVar66._0_9_;
      auVar32._10_5_ = auVar29._10_5_;
      auVar35[8] = auVar66[4];
      auVar35._0_8_ = auVar66._0_8_;
      auVar35._9_6_ = auVar32._9_6_;
      auVar67[7] = 0;
      auVar67._0_7_ = auVar35._8_7_;
      auVar52._7_8_ = 0;
      auVar52._0_7_ = auVar35._8_7_;
      auVar58._1_8_ = SUB158(auVar52 << 0x40,7);
      auVar58[0] = auVar66[3];
      auVar58._9_6_ = 0;
      auVar53._1_10_ = SUB1510(auVar58 << 0x30,5);
      auVar53[0] = auVar66[2];
      auVar59._11_4_ = 0;
      auVar59._0_11_ = auVar53;
      auVar38[2] = auVar66[1];
      auVar38._0_2_ = auVar66._0_2_;
      auVar38._3_12_ = SUB1512(auVar59 << 0x20,3);
      auVar41._2_13_ = auVar38._2_13_;
      auVar41._0_2_ = auVar66._0_2_ & 0xff;
      auVar67._8_4_ = auVar41._0_4_;
      auVar67._12_4_ = auVar53._0_4_;
      auVar66 = pshuflw(auVar67,auVar67,0x1b);
      auVar66 = pshufhw(auVar66,auVar66,0x1b);
      sVar3 = auVar66._0_2_;
      sVar4 = auVar66._2_2_;
      sVar5 = auVar66._4_2_;
      sVar6 = auVar66._6_2_;
      sVar7 = auVar66._8_2_;
      sVar8 = auVar66._10_2_;
      sVar9 = auVar66._12_2_;
      sVar10 = auVar66._14_2_;
      sVar11 = auVar75._0_2_;
      sVar12 = auVar75._2_2_;
      sVar13 = auVar75._4_2_;
      sVar14 = auVar75._6_2_;
      sVar15 = auVar75._8_2_;
      sVar16 = auVar75._10_2_;
      sVar17 = auVar75._12_2_;
      sVar18 = auVar75._14_2_;
      puVar2 = context->state + lVar63;
      *(char *)puVar2 = (0 < sVar3) * (sVar3 < 0x100) * auVar66[0] - (0xff < sVar3);
      *(char *)((long)puVar2 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar66[2] - (0xff < sVar4);
      *(char *)((long)puVar2 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar66[4] - (0xff < sVar5);
      *(char *)((long)puVar2 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar66[6] - (0xff < sVar6);
      *(char *)((long)puVar2 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar66[8] - (0xff < sVar7);
      *(char *)((long)puVar2 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar66[10] - (0xff < sVar8);
      *(char *)((long)puVar2 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar66[0xc] - (0xff < sVar9);
      *(char *)((long)puVar2 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar66[0xe] - (0xff < sVar10)
      ;
      *(char *)(puVar2 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar75[0] - (0xff < sVar11);
      *(char *)((long)puVar2 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar75[2] - (0xff < sVar12);
      *(char *)((long)puVar2 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar75[4] - (0xff < sVar13);
      *(char *)((long)puVar2 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar75[6] - (0xff < sVar14)
      ;
      *(char *)((long)puVar2 + 0xc) = (0 < sVar15) * (sVar15 < 0x100) * auVar75[8] - (0xff < sVar15)
      ;
      *(char *)((long)puVar2 + 0xd) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar75[10] - (0xff < sVar16);
      *(char *)((long)puVar2 + 0xe) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar75[0xc] - (0xff < sVar17);
      *(char *)((long)puVar2 + 0xf) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar75[0xe] - (0xff < sVar18);
      lVar63 = lVar63 + 2;
    } while (lVar63 != 0x18);
    auVar66 = *(undefined1 (*) [16])context->bitcount;
    auVar65._0_8_ = auVar66._8_8_;
    auVar65._8_4_ = auVar66._0_4_;
    auVar65._12_4_ = auVar66._4_4_;
    *(undefined1 (*) [16])(context->buffer + 0xe) = auVar65;
    sha512_Transform(context->state,puVar1,context->state);
    lVar63 = 0;
    do {
      auVar66 = *(undefined1 (*) [16])(context->state + lVar63);
      auVar78[8] = auVar66[8];
      auVar78[9] = 0;
      auVar78[10] = auVar66[9];
      auVar71._0_10_ = (unkuint10)auVar66[0xc] << 0x40;
      auVar71[10] = auVar66[0xd];
      auVar74[0xb] = 0;
      auVar74._0_11_ = auVar71;
      auVar74[0xc] = auVar66[0xe];
      auVar74[0xd] = 0;
      auVar74[0xe] = auVar66[0xf];
      auVar78[3] = 0;
      auVar78._0_3_ = auVar71._8_3_;
      auVar78._4_3_ = auVar74._12_3_;
      auVar78[7] = 0;
      auVar78[0xb] = 0;
      auVar78._12_3_ = (int3)(CONCAT16(auVar66[0xb],(uint6)auVar66[10] << 0x20) >> 0x20);
      auVar78[0xf] = 0;
      auVar75 = pshuflw(auVar78,auVar78,0x1b);
      auVar75 = pshufhw(auVar75,auVar75,0x1b);
      auVar21[0xd] = 0;
      auVar21._0_13_ = auVar66._0_13_;
      auVar21[0xe] = auVar66[7];
      auVar24[0xc] = auVar66[6];
      auVar24._0_12_ = auVar66._0_12_;
      auVar24._13_2_ = auVar21._13_2_;
      auVar27[0xb] = 0;
      auVar27._0_11_ = auVar66._0_11_;
      auVar27._12_3_ = auVar24._12_3_;
      auVar30[10] = auVar66[5];
      auVar30._0_10_ = auVar66._0_10_;
      auVar30._11_4_ = auVar27._11_4_;
      auVar33[9] = 0;
      auVar33._0_9_ = auVar66._0_9_;
      auVar33._10_5_ = auVar30._10_5_;
      auVar36[8] = auVar66[4];
      auVar36._0_8_ = auVar66._0_8_;
      auVar36._9_6_ = auVar33._9_6_;
      auVar68[7] = 0;
      auVar68._0_7_ = auVar36._8_7_;
      auVar54._7_8_ = 0;
      auVar54._0_7_ = auVar36._8_7_;
      auVar60._1_8_ = SUB158(auVar54 << 0x40,7);
      auVar60[0] = auVar66[3];
      auVar60._9_6_ = 0;
      auVar55._1_10_ = SUB1510(auVar60 << 0x30,5);
      auVar55[0] = auVar66[2];
      auVar61._11_4_ = 0;
      auVar61._0_11_ = auVar55;
      auVar39[2] = auVar66[1];
      auVar39._0_2_ = auVar66._0_2_;
      auVar39._3_12_ = SUB1512(auVar61 << 0x20,3);
      auVar42._2_13_ = auVar39._2_13_;
      auVar42._0_2_ = auVar66._0_2_ & 0xff;
      auVar68._8_4_ = auVar42._0_4_;
      auVar68._12_4_ = auVar55._0_4_;
      auVar66 = pshuflw(auVar68,auVar68,0x1b);
      auVar66 = pshufhw(auVar66,auVar66,0x1b);
      sVar3 = auVar66._0_2_;
      sVar4 = auVar66._2_2_;
      sVar5 = auVar66._4_2_;
      sVar6 = auVar66._6_2_;
      sVar7 = auVar66._8_2_;
      sVar8 = auVar66._10_2_;
      sVar9 = auVar66._12_2_;
      sVar10 = auVar66._14_2_;
      sVar11 = auVar75._0_2_;
      sVar12 = auVar75._2_2_;
      sVar13 = auVar75._4_2_;
      sVar14 = auVar75._6_2_;
      sVar15 = auVar75._8_2_;
      sVar16 = auVar75._10_2_;
      sVar17 = auVar75._12_2_;
      sVar18 = auVar75._14_2_;
      puVar1 = context->state + lVar63;
      *(char *)puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar66[0] - (0xff < sVar3);
      *(char *)((long)puVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar66[2] - (0xff < sVar4);
      *(char *)((long)puVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar66[4] - (0xff < sVar5);
      *(char *)((long)puVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar66[6] - (0xff < sVar6);
      *(char *)((long)puVar1 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar66[8] - (0xff < sVar7);
      *(char *)((long)puVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar66[10] - (0xff < sVar8);
      *(char *)((long)puVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar66[0xc] - (0xff < sVar9);
      *(char *)((long)puVar1 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar66[0xe] - (0xff < sVar10)
      ;
      *(char *)(puVar1 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar75[0] - (0xff < sVar11);
      *(char *)((long)puVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar75[2] - (0xff < sVar12);
      *(char *)((long)puVar1 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar75[4] - (0xff < sVar13);
      *(char *)((long)puVar1 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar75[6] - (0xff < sVar14)
      ;
      *(char *)((long)puVar1 + 0xc) = (0 < sVar15) * (sVar15 < 0x100) * auVar75[8] - (0xff < sVar15)
      ;
      *(char *)((long)puVar1 + 0xd) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar75[10] - (0xff < sVar16);
      *(char *)((long)puVar1 + 0xe) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar75[0xc] - (0xff < sVar17);
      *(char *)((long)puVar1 + 0xf) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar75[0xe] - (0xff < sVar18);
      lVar63 = lVar63 + 2;
    } while (lVar63 != 8);
    uVar43 = context->state[0];
    uVar44 = context->state[1];
    uVar45 = context->state[2];
    uVar46 = context->state[3];
    uVar47 = context->state[4];
    uVar48 = context->state[5];
    uVar49 = context->state[7];
    *(uint64_t *)(digest + 0x30) = context->state[6];
    *(uint64_t *)(digest + 0x38) = uVar49;
    *(uint64_t *)(digest + 0x20) = uVar47;
    *(uint64_t *)(digest + 0x28) = uVar48;
    *(uint64_t *)(digest + 0x10) = uVar45;
    *(uint64_t *)(digest + 0x18) = uVar46;
    *(uint64_t *)digest = uVar43;
    *(uint64_t *)(digest + 8) = uVar44;
  }
  memzero(context,0xd0);
  return;
}

Assistant:

void sha512_Final(trezor::SHA512_CTX* context, sha2_byte digest[]) {
	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		sha512_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE64(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA512_DIGEST_LENGTH);
	}

	/* Zero out state data */
	memzero(context, sizeof(trezor::SHA512_CTX));
}